

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

SP __thiscall pbrt::SemanticParser::findOrEmitObject(SemanticParser *this,SP *pbrtObject)

{
  _Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  *this_00;
  string *this_01;
  element_type *peVar1;
  __shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  iterator iVar6;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ostream *poVar8;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  __shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  __shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SP SVar13;
  shared_ptr<pbrt::syntactic::LightSource> lightSource;
  SP ourLightSource;
  shared_ptr<pbrt::syntactic::Shape> shape;
  undefined1 local_b8 [40];
  undefined1 local_90 [16];
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_80 [2];
  __shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (_Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
             *)(pbrtObject + 0xe);
  iVar6 = std::
          _Rb_tree<std::shared_ptr<pbrt::syntactic::Object>,_std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>,_std::_Select1st<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
          ::find(this_00,in_RDX);
  if (iVar6._M_node ==
      (_Base_ptr)
      &pbrtObject[0xe].super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount) {
    local_b8._16_8_ = pbrtObject;
    std::make_shared<pbrt::Object>();
    p_Var7 = &std::
              map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
              ::operator[]((map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                            *)this_00,in_RDX)->
              super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
              (p_Var7,(__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::__cxx11::string::_M_assign
              ((string *)
               &((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->pixelFilter);
    peVar1 = (in_RDX->super___shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var2 = &((peVar1->lightSources).
               super__Vector_base<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>;
    local_b8._24_8_ = local_90 + 8;
    this_01 = (string *)(local_90 + 0x10);
    local_b8._32_8_ = in_RDX;
    for (p_Var12 = &((peVar1->lightSources).
                     super__Vector_base<std::shared_ptr<pbrt::syntactic::LightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::LightSource>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>;
        p_Var12 != p_Var2; p_Var12 = p_Var12 + 1) {
      std::__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)local_b8,
                 p_Var12);
      std::__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_50,
                 (__shared_ptr<pbrt::syntactic::LightSource,_(__gnu_cxx::_Lock_policy)2> *)local_b8)
      ;
      findOrCreateLightSource((SemanticParser *)local_90,(SP *)local_b8._16_8_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      if ((element_type *)local_90._0_8_ == (element_type *)0x0) {
        poVar8 = std::operator<<((ostream *)&std::cout,
                                 "***warning***: could ont parse light source \'");
        (**((Node *)local_b8._0_8_)->_vptr_Node)(this_01);
        poVar8 = std::operator<<(poVar8,this_01);
        poVar8 = std::operator<<(poVar8,"\'");
        std::endl<char,std::char_traits<char>>(poVar8);
        std::__cxx11::string::~string(this_01);
      }
      else {
        std::
        vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
        ::push_back((vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
                     *)&((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr)->film,(value_type *)local_90);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    }
    peVar1 = ((__shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2> *)local_b8._32_8_)
             ->_M_ptr;
    p_Var3 = &((peVar1->shapes).
               super__Vector_base<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var10 = &((peVar1->shapes).
                     super__Vector_base<std::shared_ptr<pbrt::syntactic::Shape>,_std::allocator<std::shared_ptr<pbrt::syntactic::Shape>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>;
        p_Var10 != p_Var3; p_Var10 = p_Var10 + 1) {
      std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_90 + 0x10),p_Var10);
      std::__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_90 + 0x10));
      findOrCreateShape((SemanticParser *)local_b8,(SP *)local_b8._16_8_);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      if ((element_type *)local_b8._0_8_ != (element_type *)0x0) {
        std::vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>::
        push_back((vector<std::shared_ptr<pbrt::Shape>,_std::allocator<std::shared_ptr<pbrt::Shape>_>_>
                   *)&((this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->cameras,(value_type *)local_b8);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x18));
    }
    peVar1 = ((__shared_ptr<pbrt::syntactic::Object,_(__gnu_cxx::_Lock_policy)2> *)local_b8._32_8_)
             ->_M_ptr;
    p_Var4 = &((peVar1->objectInstances).
               super__Vector_base<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var11 = &((peVar1->objectInstances).
                     super__Vector_base<std::shared_ptr<pbrt::syntactic::Object::Instance>,_std::allocator<std::shared_ptr<pbrt::syntactic::Object::Instance>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                    super___shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2>
        ; p_Var11 != p_Var4; p_Var11 = p_Var11 + 1) {
      std::__shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_90 + 0x10),p_Var11);
      peVar5 = (this->result).super___shared_ptr<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_90 + 0x30),
                 (__shared_ptr<pbrt::syntactic::Object::Instance,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_90 + 0x10));
      emitInstance((SemanticParser *)local_b8,(SP *)local_b8._16_8_);
      std::vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>::
      emplace_back<std::shared_ptr<pbrt::Instance>>
                ((vector<std::shared_ptr<pbrt::Instance>,std::allocator<std::shared_ptr<pbrt::Instance>>>
                  *)&(peVar5->sampler).super___shared_ptr<pbrt::Sampler,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount,(shared_ptr<pbrt::Instance> *)local_b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x18));
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"created object w/ ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," shapes, ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," instances, and ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8," light sources");
    std::endl<char,std::char_traits<char>>(poVar8);
    _Var9._M_pi = extraout_RDX_00;
  }
  else {
    p_Var7 = &std::
              map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
              ::operator[]((map<std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::syntactic::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
                            *)this_00,in_RDX)->
              super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var7);
    _Var9._M_pi = extraout_RDX;
  }
  SVar13.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  SVar13.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SP)SVar13.super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Object::SP SemanticParser::findOrEmitObject(pbrt::syntactic::Object::SP pbrtObject)
  {
    if (emittedObjects.find(pbrtObject) != emittedObjects.end()) {
      return emittedObjects[pbrtObject];
    }
      
    Object::SP ourObject = std::make_shared<Object>();
    emittedObjects[pbrtObject] = ourObject;
    ourObject->name = pbrtObject->name;
    
    for (auto lightSource : pbrtObject->lightSources) {
      LightSource::SP ourLightSource = findOrCreateLightSource(lightSource);
      if (ourLightSource)
        ourObject->lightSources.push_back(ourLightSource);
      else
        std::cout << "***warning***: could ont parse light source '" << lightSource->toString() << "'"
                  << std::endl;
    }

    for (auto shape : pbrtObject->shapes) {
      Shape::SP ourShape = findOrCreateShape(shape);
      if (ourShape)
        ourObject->shapes.push_back(ourShape);
    }
    
    for (auto instance : pbrtObject->objectInstances)
      ourObject->instances.push_back(emitInstance(instance));

    std::cout << "created object w/ " << ourObject->shapes.size() << " shapes, "
              << ourObject->instances.size() << " instances, and "
              << ourObject->lightSources.size() << " light sources" << std::endl;
    return ourObject;
  }